

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QVariant * QVariant::fromMetaType(QVariant *__return_storage_ptr__,QMetaType type,void *copy)

{
  undefined1 *puVar1;
  PrivateShared *pPVar2;
  QMetaType type_00;
  bool bVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QMetaType type_local;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  type_local = type;
  QMetaType::registerHelper(&type_local);
  type_00 = type_local;
  if ((type_local.d_ptr != (QMetaTypeInterface *)0x0) && ((type_local.d_ptr)->size != 0)) {
    if (((type_local.d_ptr)->copyCtr != (CopyCtrFn)0x0) ||
       (((type_local.d_ptr)->flags & 0x4000) == 0)) {
      bVar3 = QtMetaTypePrivate::isDestructible(type_local.d_ptr);
      if (bVar3) {
        if (((copy == (void *)0x0) && ((type_00.d_ptr)->defaultCtr == (DefaultCtrFn)0x0)) &&
           (((type_00.d_ptr)->flags & 1) != 0)) {
          local_40.context.version = 2;
          local_40.context.function._4_4_ = 0;
          local_40.context.line = 0;
          local_40.context.file._0_4_ = 0;
          local_40.context._12_8_ = 0;
          local_40.context.category = "default";
          QMessageLogger::warning
                    (&local_40,"QVariant: Cannot create type \'%s\' without a default constructor",
                     (type_00.d_ptr)->name);
        }
        else {
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
          (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
          *(ulong *)&(__return_storage_ptr__->d).field_0x18 =
               (ulong)type_00.d_ptr & 0xfffffffffffffffc;
          if (copy == (void *)0x0) {
            uVar4 = 2;
          }
          else {
            uVar4 = (ulong)((uint)(((type_00.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i
                                  == 0x33) * 2);
          }
          *(ulong *)&(__return_storage_ptr__->d).field_0x18 =
               uVar4 | (ulong)type_00.d_ptr & 0xfffffffffffffffc;
          bVar3 = Private::canUseInternalSpace(type_00.d_ptr);
          if (bVar3) {
            puVar1 = &(__return_storage_ptr__->d).field_0x18;
            *puVar1 = *puVar1 & 0xfe;
            if ((copy != (void *)0x0) || ((type_00.d_ptr)->defaultCtr != (DefaultCtrFn)0x0)) {
              QtMetaTypePrivate::construct(type_00.d_ptr,__return_storage_ptr__,copy);
            }
          }
          else {
            local_40.context.version = -0x55555556;
            local_40.context.line = -0x55555556;
            customConstructSharedImpl((size_t)&local_40,(ulong)(type_00.d_ptr)->size);
            QtMetaTypePrivate::construct
                      (type_00.d_ptr,
                       (void *)((long)*(int *)(CONCAT44(local_40.context.line,
                                                        local_40.context.version) + 4) +
                               CONCAT44(local_40.context.line,local_40.context.version)),copy);
            pPVar2 = (PrivateShared *)CONCAT44(local_40.context.line,local_40.context.version);
            local_40.context.version = 0;
            local_40.context.line = 0;
            std::unique_ptr<QVariant::PrivateShared,_Deleter>::~unique_ptr
                      ((unique_ptr<QVariant::PrivateShared,_Deleter> *)&local_40);
            (__return_storage_ptr__->d).data.shared = pPVar2;
            puVar1 = &(__return_storage_ptr__->d).field_0x18;
            *puVar1 = *puVar1 | 1;
          }
        }
        goto LAB_002a30a6;
      }
    }
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context.line = 0;
    local_40.context.file._0_4_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning
              (&local_40,
               "QVariant: Provided metatype for \'%s\' does not support destruction and copy construction"
               ,(type_00.d_ptr)->name);
  }
LAB_002a30a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QVariant::fromMetaType(QMetaType type, const void *copy)
{
    QVariant result;
    type.registerType();
    const auto iface = type.iface();
    if (isValidMetaTypeForVariant(iface, copy)) {
        result.d = Private(iface);
        customConstruct(iface, &result.d, copy);
    }
    return result;
}